

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  RTCIntersectArguments *pRVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [32];
  undefined8 uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  byte bVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar26;
  uint uVar27;
  long lVar28;
  byte bVar29;
  byte bVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined4 uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  long lStack_2660;
  UVIdentity<4> mapUV;
  int local_2624;
  StackItemT<embree::NodeRefPtr<8>_> *local_2620;
  ulong local_2618;
  long local_2610;
  long local_2608;
  Scene *local_2600;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_2598;
  undefined8 local_2578;
  undefined8 uStack_2570;
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  UVIdentity<4> *local_2538;
  byte local_2530;
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  float local_24d8 [4];
  undefined1 local_24c8 [32];
  undefined1 local_24a8 [32];
  undefined1 local_2488 [32];
  undefined1 local_2468 [32];
  undefined1 local_2448 [32];
  undefined8 local_2428;
  undefined8 uStack_2420;
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_2620 = stack + 1;
    stack[0].dist = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar60 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar39._8_4_ = 0x7fffffff;
    auVar39._0_8_ = 0x7fffffff7fffffff;
    auVar39._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx512vl((undefined1  [16])aVar3,auVar39);
    auVar40._8_4_ = 0x219392ef;
    auVar40._0_8_ = 0x219392ef219392ef;
    auVar40._12_4_ = 0x219392ef;
    uVar33 = vcmpps_avx512vl(auVar39,auVar40,1);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar95 = ZEXT1664(auVar39);
    auVar39 = vdivps_avx512vl(auVar39,(undefined1  [16])aVar3);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar38 = (bool)((byte)uVar33 & 1);
    auVar44._0_4_ = (uint)bVar38 * auVar40._0_4_ | (uint)!bVar38 * auVar39._0_4_;
    bVar38 = (bool)((byte)(uVar33 >> 1) & 1);
    auVar44._4_4_ = (uint)bVar38 * auVar40._4_4_ | (uint)!bVar38 * auVar39._4_4_;
    bVar38 = (bool)((byte)(uVar33 >> 2) & 1);
    auVar44._8_4_ = (uint)bVar38 * auVar40._8_4_ | (uint)!bVar38 * auVar39._8_4_;
    bVar38 = (bool)((byte)(uVar33 >> 3) & 1);
    auVar44._12_4_ = (uint)bVar38 * auVar40._12_4_ | (uint)!bVar38 * auVar39._12_4_;
    auVar41._8_4_ = 0x3f7ffffa;
    auVar41._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar41._12_4_ = 0x3f7ffffa;
    auVar41 = vmulps_avx512vl(auVar44,auVar41);
    auVar42._8_4_ = 0x3f800003;
    auVar42._0_8_ = 0x3f8000033f800003;
    auVar42._12_4_ = 0x3f800003;
    auVar42 = vmulps_avx512vl(auVar44,auVar42);
    local_2448 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar96 = ZEXT3264(local_2448);
    local_2468 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar97 = ZEXT3264(local_2468);
    local_2488 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar98 = ZEXT3264(local_2488);
    local_24a8 = vbroadcastss_avx512vl(auVar41);
    auVar99 = ZEXT3264(local_24a8);
    auVar39 = vmovshdup_avx(auVar41);
    local_24c8 = vbroadcastsd_avx512vl(auVar39);
    auVar100 = ZEXT3264(local_24c8);
    auVar40 = vshufpd_avx(auVar41,auVar41,1);
    auVar63._8_4_ = 2;
    auVar63._0_8_ = 0x200000002;
    auVar63._12_4_ = 2;
    auVar63._16_4_ = 2;
    auVar63._20_4_ = 2;
    auVar63._24_4_ = 2;
    auVar63._28_4_ = 2;
    local_2398 = vpermps_avx2(auVar63,ZEXT1632(auVar41));
    auVar83 = ZEXT3264(local_2398);
    fVar70 = auVar42._0_4_;
    auVar62._8_4_ = 1;
    auVar62._0_8_ = 0x100000001;
    auVar62._12_4_ = 1;
    auVar62._16_4_ = 1;
    auVar62._20_4_ = 1;
    auVar62._24_4_ = 1;
    auVar62._28_4_ = 1;
    local_23d8 = vpermps_avx2(auVar62,ZEXT1632(auVar42));
    auVar90 = ZEXT3264(local_23d8);
    local_23f8 = vpermps_avx2(auVar63,ZEXT1632(auVar42));
    auVar91 = ZEXT3264(local_23f8);
    uVar34 = (ulong)(auVar41._0_4_ < 0.0) * 0x20;
    uVar33 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x40;
    uVar37 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x80;
    uVar31 = uVar33 ^ 0x20;
    uVar76 = auVar43._0_4_;
    local_2418._4_4_ = uVar76;
    local_2418._0_4_ = uVar76;
    local_2418._8_4_ = uVar76;
    local_2418._12_4_ = uVar76;
    local_2418._16_4_ = uVar76;
    local_2418._20_4_ = uVar76;
    local_2418._24_4_ = uVar76;
    local_2418._28_4_ = uVar76;
    auVar92 = ZEXT3264(local_2418);
    uVar76 = auVar60._0_4_;
    auVar75 = ZEXT3264(CONCAT428(uVar76,CONCAT424(uVar76,CONCAT420(uVar76,CONCAT416(uVar76,CONCAT412
                                                  (uVar76,CONCAT48(uVar76,CONCAT44(uVar76,uVar76))))
                                                  ))));
    auVar62 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar93 = ZEXT3264(auVar62);
    auVar62 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar94 = ZEXT3264(auVar62);
    local_23b8 = fVar70;
    fStack_23b4 = fVar70;
    fStack_23b0 = fVar70;
    fStack_23ac = fVar70;
    fStack_23a8 = fVar70;
    fStack_23a4 = fVar70;
    fStack_23a0 = fVar70;
    fStack_239c = fVar70;
    local_2618 = uVar33;
    fVar84 = fVar70;
    fVar85 = fVar70;
    fVar86 = fVar70;
    fVar87 = fVar70;
    fVar88 = fVar70;
    fVar89 = fVar70;
LAB_01c5bc19:
    if (local_2620 != stack) {
      pSVar26 = local_2620 + -1;
      local_2620 = local_2620 + -1;
      if ((float)pSVar26->dist <= (ray->super_RayK<1>).tfar) {
        sVar35 = (local_2620->ptr).ptr;
LAB_01c5bc3f:
        do {
          if ((sVar35 & 8) != 0) goto LAB_01c5bffe;
          auVar62 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar34),auVar96._0_32_);
          auVar62 = vmulps_avx512vl(auVar99._0_32_,auVar62);
          auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar33),auVar97._0_32_);
          auVar63 = vmulps_avx512vl(auVar100._0_32_,auVar63);
          auVar62 = vmaxps_avx(auVar62,auVar63);
          auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar37),auVar98._0_32_);
          auVar64._4_4_ = auVar83._4_4_ * auVar63._4_4_;
          auVar64._0_4_ = auVar83._0_4_ * auVar63._0_4_;
          auVar64._8_4_ = auVar83._8_4_ * auVar63._8_4_;
          auVar64._12_4_ = auVar83._12_4_ * auVar63._12_4_;
          auVar64._16_4_ = auVar83._16_4_ * auVar63._16_4_;
          auVar64._20_4_ = auVar83._20_4_ * auVar63._20_4_;
          auVar64._24_4_ = auVar83._24_4_ * auVar63._24_4_;
          auVar64._28_4_ = auVar63._28_4_;
          auVar63 = vmaxps_avx(auVar64,auVar92._0_32_);
          auVar62 = vmaxps_avx(auVar62,auVar63);
          auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + (uVar34 ^ 0x20)),
                                    auVar96._0_32_);
          auVar65._4_4_ = fVar84 * auVar63._4_4_;
          auVar65._0_4_ = fVar70 * auVar63._0_4_;
          auVar65._8_4_ = fVar85 * auVar63._8_4_;
          auVar65._12_4_ = fVar86 * auVar63._12_4_;
          auVar65._16_4_ = fVar87 * auVar63._16_4_;
          auVar65._20_4_ = fVar88 * auVar63._20_4_;
          auVar65._24_4_ = fVar89 * auVar63._24_4_;
          auVar65._28_4_ = auVar63._28_4_;
          auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar31),auVar97._0_32_);
          auVar66._4_4_ = auVar90._4_4_ * auVar63._4_4_;
          auVar66._0_4_ = auVar90._0_4_ * auVar63._0_4_;
          auVar66._8_4_ = auVar90._8_4_ * auVar63._8_4_;
          auVar66._12_4_ = auVar90._12_4_ * auVar63._12_4_;
          auVar66._16_4_ = auVar90._16_4_ * auVar63._16_4_;
          auVar66._20_4_ = auVar90._20_4_ * auVar63._20_4_;
          auVar66._24_4_ = auVar90._24_4_ * auVar63._24_4_;
          auVar66._28_4_ = auVar63._28_4_;
          auVar63 = vminps_avx(auVar65,auVar66);
          auVar64 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + (uVar37 ^ 0x20)),
                                    auVar98._0_32_);
          auVar67._4_4_ = auVar91._4_4_ * auVar64._4_4_;
          auVar67._0_4_ = auVar91._0_4_ * auVar64._0_4_;
          auVar67._8_4_ = auVar91._8_4_ * auVar64._8_4_;
          auVar67._12_4_ = auVar91._12_4_ * auVar64._12_4_;
          auVar67._16_4_ = auVar91._16_4_ * auVar64._16_4_;
          auVar67._20_4_ = auVar91._20_4_ * auVar64._20_4_;
          auVar67._24_4_ = auVar91._24_4_ * auVar64._24_4_;
          auVar67._28_4_ = auVar64._28_4_;
          auVar64 = vminps_avx(auVar67,auVar75._0_32_);
          auVar63 = vminps_avx(auVar63,auVar64);
          uVar36 = vcmpps_avx512vl(auVar62,auVar63,2);
          bVar29 = (byte)uVar36;
          if (bVar29 == 0) break;
          auVar63 = *(undefined1 (*) [32])(sVar35 & 0xfffffffffffffff0);
          auVar64 = ((undefined1 (*) [32])(sVar35 & 0xfffffffffffffff0))[1];
          auVar65 = vpternlogd_avx512vl(auVar93._0_32_,auVar62,auVar94._0_32_,0xf8);
          auVar66 = vpcompressd_avx512vl(auVar65);
          auVar69._0_4_ =
               (uint)(bVar29 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar65._0_4_;
          bVar38 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar69._4_4_ = (uint)bVar38 * auVar66._4_4_ | (uint)!bVar38 * auVar65._4_4_;
          bVar38 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar69._8_4_ = (uint)bVar38 * auVar66._8_4_ | (uint)!bVar38 * auVar65._8_4_;
          bVar38 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar69._12_4_ = (uint)bVar38 * auVar66._12_4_ | (uint)!bVar38 * auVar65._12_4_;
          bVar38 = (bool)((byte)(uVar36 >> 4) & 1);
          auVar69._16_4_ = (uint)bVar38 * auVar66._16_4_ | (uint)!bVar38 * auVar65._16_4_;
          bVar38 = (bool)((byte)(uVar36 >> 5) & 1);
          auVar69._20_4_ = (uint)bVar38 * auVar66._20_4_ | (uint)!bVar38 * auVar65._20_4_;
          bVar38 = (bool)((byte)(uVar36 >> 6) & 1);
          auVar69._24_4_ = (uint)bVar38 * auVar66._24_4_ | (uint)!bVar38 * auVar65._24_4_;
          bVar38 = SUB81(uVar36 >> 7,0);
          auVar69._28_4_ = (uint)bVar38 * auVar66._28_4_ | (uint)!bVar38 * auVar65._28_4_;
          auVar65 = vpermt2q_avx512vl(auVar63,auVar69,auVar64);
          sVar35 = auVar65._0_8_;
          bVar29 = bVar29 - 1 & bVar29;
          if (bVar29 != 0) {
            auVar65 = vpshufd_avx2(auVar69,0x55);
            vpermt2q_avx512vl(auVar63,auVar65,auVar64);
            auVar66 = vpminsd_avx2(auVar69,auVar65);
            auVar65 = vpmaxsd_avx2(auVar69,auVar65);
            bVar29 = bVar29 - 1 & bVar29;
            if (bVar29 == 0) {
              auVar66 = vpermi2q_avx512vl(auVar66,auVar63,auVar64);
              sVar35 = auVar66._0_8_;
              auVar63 = vpermt2q_avx512vl(auVar63,auVar65,auVar64);
              (local_2620->ptr).ptr = auVar63._0_8_;
              lVar28 = 8;
              lStack_2660 = 0x10;
            }
            else {
              auVar80 = vpshufd_avx2(auVar69,0xaa);
              vpermt2q_avx512vl(auVar63,auVar80,auVar64);
              auVar67 = vpminsd_avx2(auVar66,auVar80);
              auVar66 = vpmaxsd_avx2(auVar66,auVar80);
              auVar80 = vpminsd_avx2(auVar65,auVar66);
              auVar66 = vpmaxsd_avx2(auVar65,auVar66);
              bVar29 = bVar29 - 1 & bVar29;
              if (bVar29 == 0) {
                auVar65 = vpermi2q_avx512vl(auVar67,auVar63,auVar64);
                sVar35 = auVar65._0_8_;
                auVar65 = vpermt2q_avx512vl(auVar63,auVar66,auVar64);
                (local_2620->ptr).ptr = auVar65._0_8_;
                auVar65 = vpermd_avx2(auVar66,auVar62);
                local_2620->dist = auVar65._0_4_;
                auVar63 = vpermt2q_avx512vl(auVar63,auVar80,auVar64);
                local_2620[1].ptr.ptr = auVar63._0_8_;
                lStack_2660 = 0x18;
                lVar28 = lStack_2660;
                lStack_2660 = 0x20;
                auVar65 = auVar80;
              }
              else {
                auVar65 = vpshufd_avx2(auVar69,0xff);
                vpermt2q_avx512vl(auVar63,auVar65,auVar64);
                auVar17 = vpminsd_avx2(auVar67,auVar65);
                auVar67 = vpmaxsd_avx2(auVar67,auVar65);
                auVar65 = vpminsd_avx2(auVar80,auVar67);
                auVar67 = vpmaxsd_avx2(auVar80,auVar67);
                auVar80 = vpminsd_avx2(auVar66,auVar67);
                auVar66 = vpmaxsd_avx2(auVar66,auVar67);
                bVar29 = bVar29 - 1 & bVar29;
                if (bVar29 != 0) {
                  auVar68 = valignd_avx512vl(auVar69,auVar69,3);
                  auVar67 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar69 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar67,auVar17);
                  auVar67 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar65 = vpermt2d_avx512vl(auVar69,auVar67,auVar65);
                  auVar67 = vpermt2d_avx512vl(auVar65,auVar67,auVar80);
                  auVar65 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar65 = vpermt2d_avx512vl(auVar67,auVar65,auVar66);
                  auVar95 = ZEXT3264(auVar65);
                  bVar30 = bVar29;
                  do {
                    auVar66 = auVar95._0_32_;
                    auVar80._8_4_ = 1;
                    auVar80._0_8_ = 0x100000001;
                    auVar80._12_4_ = 1;
                    auVar80._16_4_ = 1;
                    auVar80._20_4_ = 1;
                    auVar80._24_4_ = 1;
                    auVar80._28_4_ = 1;
                    auVar65 = vpermd_avx2(auVar80,auVar68);
                    auVar68 = valignd_avx512vl(auVar68,auVar68,1);
                    vpermt2q_avx512vl(auVar63,auVar68,auVar64);
                    bVar30 = bVar30 - 1 & bVar30;
                    uVar22 = vpcmpd_avx512vl(auVar65,auVar66,5);
                    auVar65 = vpmaxsd_avx2(auVar65,auVar66);
                    bVar23 = (byte)uVar22 << 1;
                    auVar66 = valignd_avx512vl(auVar66,auVar66,7);
                    bVar38 = (bool)((byte)uVar22 & 1);
                    bVar12 = (bool)(bVar23 >> 2 & 1);
                    bVar13 = (bool)(bVar23 >> 3 & 1);
                    bVar14 = (bool)(bVar23 >> 4 & 1);
                    bVar15 = (bool)(bVar23 >> 5 & 1);
                    bVar16 = (bool)(bVar23 >> 6 & 1);
                    auVar95 = ZEXT3264(CONCAT428((uint)(bVar23 >> 7) * auVar66._28_4_ |
                                                 (uint)!(bool)(bVar23 >> 7) * auVar65._28_4_,
                                                 CONCAT424((uint)bVar16 * auVar66._24_4_ |
                                                           (uint)!bVar16 * auVar65._24_4_,
                                                           CONCAT420((uint)bVar15 * auVar66._20_4_ |
                                                                     (uint)!bVar15 * auVar65._20_4_,
                                                                     CONCAT416((uint)bVar14 *
                                                                               auVar66._16_4_ |
                                                                               (uint)!bVar14 *
                                                                               auVar65._16_4_,
                                                                               CONCAT412((uint)
                                                  bVar13 * auVar66._12_4_ |
                                                  (uint)!bVar13 * auVar65._12_4_,
                                                  CONCAT48((uint)bVar12 * auVar66._8_4_ |
                                                           (uint)!bVar12 * auVar65._8_4_,
                                                           CONCAT44((uint)bVar38 * auVar66._4_4_ |
                                                                    (uint)!bVar38 * auVar65._4_4_,
                                                                    auVar65._0_4_))))))));
                  } while (bVar30 != 0);
                  lVar28 = (ulong)(uint)POPCOUNT((uint)bVar29) + 3;
                  while( true ) {
                    auVar66 = auVar95._0_32_;
                    auVar65 = vpermt2q_avx512vl(auVar63,auVar66,auVar64);
                    sVar35 = auVar65._0_8_;
                    bVar38 = lVar28 == 0;
                    lVar28 = lVar28 + -1;
                    if (bVar38) break;
                    (local_2620->ptr).ptr = sVar35;
                    auVar65 = vpermd_avx2(auVar66,auVar62);
                    local_2620->dist = auVar65._0_4_;
                    auVar65 = valignd_avx512vl(auVar66,auVar66,1);
                    auVar95 = ZEXT3264(auVar65);
                    local_2620 = local_2620 + 1;
                  }
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar95 = ZEXT1664(auVar43);
                  auVar96 = ZEXT3264(local_2448);
                  auVar97 = ZEXT3264(local_2468);
                  auVar98 = ZEXT3264(local_2488);
                  auVar99 = ZEXT3264(local_24a8);
                  auVar100 = ZEXT3264(local_24c8);
                  goto LAB_01c5bc3f;
                }
                auVar67 = vpermi2q_avx512vl(auVar17,auVar63,auVar64);
                sVar35 = auVar67._0_8_;
                auVar67 = vpermt2q_avx512vl(auVar63,auVar66,auVar64);
                (local_2620->ptr).ptr = auVar67._0_8_;
                auVar66 = vpermd_avx2(auVar66,auVar62);
                local_2620->dist = auVar66._0_4_;
                auVar66 = vpermt2q_avx512vl(auVar63,auVar80,auVar64);
                local_2620[1].ptr.ptr = auVar66._0_8_;
                auVar66 = vpermd_avx2(auVar80,auVar62);
                local_2620[1].dist = auVar66._0_4_;
                auVar63 = vpermt2q_avx512vl(auVar63,auVar65,auVar64);
                local_2620[2].ptr.ptr = auVar63._0_8_;
                lVar28 = 0x28;
                lStack_2660 = 0x30;
              }
            }
            auVar62 = vpermd_avx2(auVar65,auVar62);
            *(int *)((long)&(local_2620->ptr).ptr + lVar28) = auVar62._0_4_;
            local_2620 = (StackItemT<embree::NodeRefPtr<8>_> *)
                         ((long)&(local_2620->ptr).ptr + lStack_2660);
          }
        } while( true );
      }
      goto LAB_01c5bc19;
    }
  }
  return;
LAB_01c5bffe:
  local_2610 = (ulong)((uint)sVar35 & 0xf) - 8;
  uVar36 = sVar35 & 0xfffffffffffffff0;
  for (local_2608 = 0; local_2608 != local_2610; local_2608 = local_2608 + 1) {
    lVar28 = local_2608 * 0x50;
    local_2600 = context->scene;
    ppfVar5 = (context->scene->vertices).items;
    pfVar6 = ppfVar5[*(uint *)(uVar36 + 0x30 + lVar28)];
    pfVar7 = ppfVar5[*(uint *)(uVar36 + 0x34 + lVar28)];
    pfVar8 = ppfVar5[*(uint *)(uVar36 + 0x38 + lVar28)];
    pfVar9 = ppfVar5[*(uint *)(uVar36 + 0x3c + lVar28)];
    auVar39 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + lVar28)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 8 + lVar28)));
    auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + lVar28)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 8 + lVar28)));
    auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 4 + lVar28)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar36 + 0xc + lVar28)));
    auVar60 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 4 + lVar28)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar36 + 0xc + lVar28)));
    auVar41 = vunpcklps_avx(auVar43,auVar60);
    auVar42 = vunpcklps_avx(auVar39,auVar40);
    auVar60 = vunpckhps_avx(auVar39,auVar40);
    auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x10 + lVar28)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x18 + lVar28)));
    auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x10 + lVar28)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x18 + lVar28)));
    auVar44 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x14 + lVar28)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar36 + 0x1c + lVar28)));
    auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x14 + lVar28)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar36 + 0x1c + lVar28)));
    auVar47 = vunpcklps_avx(auVar43,auVar39);
    auVar45 = vunpcklps_avx(auVar40,auVar44);
    auVar39 = vunpckhps_avx(auVar40,auVar44);
    auVar44 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x20 + lVar28)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x28 + lVar28)));
    auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x20 + lVar28)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x28 + lVar28)));
    auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x24 + lVar28)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar36 + 0x2c + lVar28)));
    auVar40 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x24 + lVar28)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar36 + 0x2c + lVar28)));
    auVar49 = vunpcklps_avx(auVar43,auVar40);
    auVar48 = vunpcklps_avx(auVar44,auVar46);
    auVar40 = vunpckhps_avx(auVar44,auVar46);
    puVar1 = (undefined8 *)(uVar36 + 0x30 + lVar28);
    local_2428 = *puVar1;
    uStack_2420 = puVar1[1];
    puVar1 = (undefined8 *)(uVar36 + 0x40 + lVar28);
    local_2578 = *puVar1;
    uStack_2570 = puVar1[1];
    uVar76 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar50._4_4_ = uVar76;
    auVar50._0_4_ = uVar76;
    auVar50._8_4_ = uVar76;
    auVar50._12_4_ = uVar76;
    uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar51._4_4_ = uVar76;
    auVar51._0_4_ = uVar76;
    auVar51._8_4_ = uVar76;
    auVar51._12_4_ = uVar76;
    auVar44 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    uVar76 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar79._4_4_ = uVar76;
    auVar79._0_4_ = uVar76;
    auVar79._8_4_ = uVar76;
    auVar79._12_4_ = uVar76;
    uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar81._4_4_ = uVar76;
    auVar81._0_4_ = uVar76;
    auVar81._8_4_ = uVar76;
    auVar81._12_4_ = uVar76;
    mapUV = (UVIdentity<4>)0x0;
    fVar84 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar82._4_4_ = fVar84;
    auVar82._0_4_ = fVar84;
    auVar82._8_4_ = fVar84;
    auVar82._12_4_ = fVar84;
    auVar43 = vsubps_avx(auVar42,auVar50);
    auVar60 = vsubps_avx(auVar60,auVar51);
    auVar42 = vsubps_avx512vl(auVar41,auVar44);
    auVar45 = vsubps_avx512vl(auVar45,auVar50);
    auVar46 = vsubps_avx512vl(auVar39,auVar51);
    auVar47 = vsubps_avx512vl(auVar47,auVar44);
    auVar39 = vsubps_avx(auVar48,auVar50);
    auVar48 = vsubps_avx512vl(auVar40,auVar51);
    auVar44 = vsubps_avx512vl(auVar49,auVar44);
    auVar40 = vsubps_avx(auVar39,auVar43);
    auVar49 = vsubps_avx512vl(auVar48,auVar60);
    auVar50 = vsubps_avx512vl(auVar44,auVar42);
    auVar51 = vsubps_avx512vl(auVar43,auVar45);
    auVar52 = vsubps_avx512vl(auVar60,auVar46);
    auVar53 = vsubps_avx512vl(auVar42,auVar47);
    auVar54 = vsubps_avx512vl(auVar45,auVar39);
    auVar55 = vsubps_avx512vl(auVar46,auVar48);
    auVar56 = vsubps_avx512vl(auVar47,auVar44);
    auVar59._0_4_ = auVar39._0_4_ + auVar43._0_4_;
    auVar59._4_4_ = auVar39._4_4_ + auVar43._4_4_;
    auVar59._8_4_ = auVar39._8_4_ + auVar43._8_4_;
    auVar59._12_4_ = auVar39._12_4_ + auVar43._12_4_;
    auVar41 = vaddps_avx512vl(auVar48,auVar60);
    auVar57 = vaddps_avx512vl(auVar44,auVar42);
    auVar58 = vmulps_avx512vl(auVar41,auVar50);
    auVar58 = vfmsub231ps_avx512vl(auVar58,auVar49,auVar57);
    auVar57 = vmulps_avx512vl(auVar57,auVar40);
    auVar57 = vfmsub231ps_avx512vl(auVar57,auVar50,auVar59);
    auVar77._0_4_ = auVar49._0_4_ * auVar59._0_4_;
    auVar77._4_4_ = auVar49._4_4_ * auVar59._4_4_;
    auVar77._8_4_ = auVar49._8_4_ * auVar59._8_4_;
    auVar77._12_4_ = auVar49._12_4_ * auVar59._12_4_;
    auVar41 = vfmsub231ps_fma(auVar77,auVar40,auVar41);
    auVar78._0_4_ = fVar84 * auVar41._0_4_;
    auVar78._4_4_ = fVar84 * auVar41._4_4_;
    auVar78._8_4_ = fVar84 * auVar41._8_4_;
    auVar78._12_4_ = fVar84 * auVar41._12_4_;
    auVar41 = vfmadd231ps_avx512vl(auVar78,auVar81,auVar57);
    local_2568 = vfmadd231ps_avx512vl(auVar41,auVar79,auVar58);
    auVar41 = vaddps_avx512vl(auVar43,auVar45);
    auVar57 = vaddps_avx512vl(auVar60,auVar46);
    auVar58 = vaddps_avx512vl(auVar42,auVar47);
    auVar59 = vmulps_avx512vl(auVar57,auVar53);
    auVar59 = vfmsub231ps_avx512vl(auVar59,auVar52,auVar58);
    auVar58 = vmulps_avx512vl(auVar58,auVar51);
    auVar58 = vfmsub231ps_avx512vl(auVar58,auVar53,auVar41);
    auVar41 = vmulps_avx512vl(auVar41,auVar52);
    auVar41 = vfmsub231ps_avx512vl(auVar41,auVar51,auVar57);
    auVar57._0_4_ = fVar84 * auVar41._0_4_;
    auVar57._4_4_ = fVar84 * auVar41._4_4_;
    auVar57._8_4_ = fVar84 * auVar41._8_4_;
    auVar57._12_4_ = fVar84 * auVar41._12_4_;
    auVar41 = vfmadd231ps_avx512vl(auVar57,auVar81,auVar58);
    local_2558 = vfmadd231ps_avx512vl(auVar41,auVar79,auVar59);
    auVar39 = vaddps_avx512vl(auVar45,auVar39);
    auVar41 = vaddps_avx512vl(auVar46,auVar48);
    auVar44 = vaddps_avx512vl(auVar47,auVar44);
    auVar47 = vmulps_avx512vl(auVar41,auVar56);
    auVar47 = vfmsub231ps_avx512vl(auVar47,auVar55,auVar44);
    auVar44 = vmulps_avx512vl(auVar44,auVar54);
    auVar44 = vfmsub231ps_avx512vl(auVar44,auVar56,auVar39);
    auVar46._0_4_ = auVar39._0_4_ * auVar55._0_4_;
    auVar46._4_4_ = auVar39._4_4_ * auVar55._4_4_;
    auVar46._8_4_ = auVar39._8_4_ * auVar55._8_4_;
    auVar46._12_4_ = auVar39._12_4_ * auVar55._12_4_;
    auVar39 = vfmsub231ps_avx512vl(auVar46,auVar54,auVar41);
    auVar39 = vmulps_avx512vl(auVar82,auVar39);
    auVar39 = vfmadd231ps_avx512vl(auVar39,auVar81,auVar44);
    auVar39 = vfmadd231ps_avx512vl(auVar39,auVar79,auVar47);
    auVar48._0_4_ = local_2558._0_4_ + local_2568._0_4_;
    auVar48._4_4_ = local_2558._4_4_ + local_2568._4_4_;
    auVar48._8_4_ = local_2558._8_4_ + local_2568._8_4_;
    auVar48._12_4_ = local_2558._12_4_ + local_2568._12_4_;
    local_2548 = vaddps_avx512vl(auVar39,auVar48);
    auVar47._8_4_ = 0x7fffffff;
    auVar47._0_8_ = 0x7fffffff7fffffff;
    auVar47._12_4_ = 0x7fffffff;
    auVar41 = vandps_avx512vl(local_2548,auVar47);
    auVar45._8_4_ = 0x34000000;
    auVar45._0_8_ = 0x3400000034000000;
    auVar45._12_4_ = 0x34000000;
    auVar44 = vmulps_avx512vl(auVar41,auVar45);
    auVar47 = vminps_avx512vl(local_2568,local_2558);
    auVar47 = vminps_avx512vl(auVar47,auVar39);
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar45 = vxorps_avx512vl(auVar44,auVar45);
    uVar22 = vcmpps_avx512vl(auVar47,auVar45,5);
    auVar47 = vmaxps_avx512vl(local_2568,local_2558);
    auVar39 = vmaxps_avx512vl(auVar47,auVar39);
    uVar18 = vcmpps_avx512vl(auVar39,auVar44,2);
    bVar29 = ((byte)uVar22 | (byte)uVar18) & 0xf;
    if (bVar29 != 0) {
      auVar39 = vmulps_avx512vl(auVar50,auVar52);
      auVar44 = vmulps_avx512vl(auVar40,auVar53);
      auVar47 = vmulps_avx512vl(auVar49,auVar51);
      auVar45 = vmulps_avx512vl(auVar53,auVar55);
      auVar46 = vmulps_avx512vl(auVar51,auVar56);
      auVar48 = vmulps_avx512vl(auVar52,auVar54);
      auVar49 = vfmsub213ps_avx512vl(auVar49,auVar53,auVar39);
      auVar50 = vfmsub213ps_avx512vl(auVar50,auVar51,auVar44);
      auVar40 = vfmsub213ps_avx512vl(auVar40,auVar52,auVar47);
      auVar52 = vfmsub213ps_avx512vl(auVar56,auVar52,auVar45);
      auVar53 = vfmsub213ps_avx512vl(auVar54,auVar53,auVar46);
      auVar51 = vfmsub213ps_avx512vl(auVar55,auVar51,auVar48);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar39 = vandps_avx512vl(auVar39,auVar54);
      auVar45 = vandps_avx512vl(auVar45,auVar54);
      uVar33 = vcmpps_avx512vl(auVar39,auVar45,1);
      auVar39 = vandps_avx512vl(auVar44,auVar54);
      auVar44 = vandps_avx512vl(auVar46,auVar54);
      uVar19 = vcmpps_avx512vl(auVar39,auVar44,1);
      auVar39 = vandps_avx512vl(auVar47,auVar54);
      auVar44 = vandps_avx512vl(auVar48,auVar54);
      uVar20 = vcmpps_avx512vl(auVar39,auVar44,1);
      bVar38 = (bool)((byte)uVar33 & 1);
      local_24f8._0_4_ = (uint)bVar38 * auVar49._0_4_ | (uint)!bVar38 * auVar52._0_4_;
      bVar38 = (bool)((byte)(uVar33 >> 1) & 1);
      local_24f8._4_4_ = (uint)bVar38 * auVar49._4_4_ | (uint)!bVar38 * auVar52._4_4_;
      bVar38 = (bool)((byte)(uVar33 >> 2) & 1);
      local_24f8._8_4_ = (uint)bVar38 * auVar49._8_4_ | (uint)!bVar38 * auVar52._8_4_;
      bVar38 = (bool)((byte)(uVar33 >> 3) & 1);
      local_24f8._12_4_ = (uint)bVar38 * auVar49._12_4_ | (uint)!bVar38 * auVar52._12_4_;
      bVar38 = (bool)((byte)uVar19 & 1);
      local_24e8._0_4_ = (uint)bVar38 * auVar50._0_4_ | (uint)!bVar38 * auVar53._0_4_;
      bVar38 = (bool)((byte)(uVar19 >> 1) & 1);
      local_24e8._4_4_ = (uint)bVar38 * auVar50._4_4_ | (uint)!bVar38 * auVar53._4_4_;
      bVar38 = (bool)((byte)(uVar19 >> 2) & 1);
      local_24e8._8_4_ = (uint)bVar38 * auVar50._8_4_ | (uint)!bVar38 * auVar53._8_4_;
      bVar38 = (bool)((byte)(uVar19 >> 3) & 1);
      local_24e8._12_4_ = (uint)bVar38 * auVar50._12_4_ | (uint)!bVar38 * auVar53._12_4_;
      bVar38 = (bool)((byte)uVar20 & 1);
      local_24d8[0] = (float)((uint)bVar38 * auVar40._0_4_ | (uint)!bVar38 * auVar51._0_4_);
      bVar38 = (bool)((byte)(uVar20 >> 1) & 1);
      local_24d8[1] = (float)((uint)bVar38 * auVar40._4_4_ | (uint)!bVar38 * auVar51._4_4_);
      bVar38 = (bool)((byte)(uVar20 >> 2) & 1);
      local_24d8[2] = (float)((uint)bVar38 * auVar40._8_4_ | (uint)!bVar38 * auVar51._8_4_);
      bVar38 = (bool)((byte)(uVar20 >> 3) & 1);
      local_24d8[3] = (float)((uint)bVar38 * auVar40._12_4_ | (uint)!bVar38 * auVar51._12_4_);
      auVar54._0_4_ = fVar84 * local_24d8[0];
      auVar54._4_4_ = fVar84 * local_24d8[1];
      auVar54._8_4_ = fVar84 * local_24d8[2];
      auVar54._12_4_ = fVar84 * local_24d8[3];
      auVar39 = vfmadd213ps_fma(auVar81,local_24e8,auVar54);
      auVar39 = vfmadd213ps_fma(auVar79,local_24f8,auVar39);
      auVar52._0_4_ = auVar39._0_4_ + auVar39._0_4_;
      auVar52._4_4_ = auVar39._4_4_ + auVar39._4_4_;
      auVar52._8_4_ = auVar39._8_4_ + auVar39._8_4_;
      auVar52._12_4_ = auVar39._12_4_ + auVar39._12_4_;
      auVar53._0_4_ = auVar42._0_4_ * local_24d8[0];
      auVar53._4_4_ = auVar42._4_4_ * local_24d8[1];
      auVar53._8_4_ = auVar42._8_4_ * local_24d8[2];
      auVar53._12_4_ = auVar42._12_4_ * local_24d8[3];
      auVar60 = vfmadd213ps_fma(auVar60,local_24e8,auVar53);
      auVar60 = vfmadd213ps_fma(auVar43,local_24f8,auVar60);
      auVar43 = vrcp14ps_avx512vl(auVar52);
      auVar40 = auVar95._0_16_;
      auVar39 = vfnmadd213ps_avx512vl(auVar43,auVar52,auVar40);
      auVar43 = vfmadd132ps_fma(auVar39,auVar43,auVar43);
      local_2508._0_4_ = (auVar60._0_4_ + auVar60._0_4_) * auVar43._0_4_;
      local_2508._4_4_ = (auVar60._4_4_ + auVar60._4_4_) * auVar43._4_4_;
      local_2508._8_4_ = (auVar60._8_4_ + auVar60._8_4_) * auVar43._8_4_;
      local_2508._12_4_ = (auVar60._12_4_ + auVar60._12_4_) * auVar43._12_4_;
      auVar75 = ZEXT1664(local_2508);
      uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar43._4_4_ = uVar76;
      auVar43._0_4_ = uVar76;
      auVar43._8_4_ = uVar76;
      auVar43._12_4_ = uVar76;
      uVar22 = vcmpps_avx512vl(local_2508,auVar43,0xd);
      uVar33 = CONCAT44(auVar52._4_4_,auVar52._0_4_);
      auVar49._0_8_ = uVar33 ^ 0x8000000080000000;
      auVar49._8_4_ = -auVar52._8_4_;
      auVar49._12_4_ = -auVar52._12_4_;
      fVar84 = (ray->super_RayK<1>).tfar;
      auVar60._4_4_ = fVar84;
      auVar60._0_4_ = fVar84;
      auVar60._8_4_ = fVar84;
      auVar60._12_4_ = fVar84;
      uVar18 = vcmpps_avx512vl(local_2508,auVar60,2);
      uVar21 = vcmpps_avx512vl(auVar52,auVar49,4);
      bVar29 = (byte)uVar22 & (byte)uVar18 & (byte)uVar21 & bVar29;
      if (bVar29 != 0) {
        auVar55._0_4_ = (ray->super_RayK<1>).tfar;
        auVar55._4_4_ = (ray->super_RayK<1>).mask;
        auVar55._8_4_ = (ray->super_RayK<1>).id;
        auVar55._12_4_ = (ray->super_RayK<1>).flags;
        auVar83 = ZEXT1664(auVar55);
        uVar27 = vextractps_avx(auVar55,1);
        local_2538 = &mapUV;
        local_2530 = bVar29;
        auVar56._8_4_ = 0x219392ef;
        auVar56._0_8_ = 0x219392ef219392ef;
        auVar56._12_4_ = 0x219392ef;
        uVar33 = vcmpps_avx512vl(auVar41,auVar56,5);
        auVar43 = vrcp14ps_avx512vl(local_2548);
        auVar60 = vfnmadd213ps_avx512vl(local_2548,auVar43,auVar40);
        auVar43 = vfmadd132ps_avx512vl(auVar60,auVar43,auVar43);
        fVar84 = (float)((uint)((byte)uVar33 & 1) * auVar43._0_4_);
        fVar85 = (float)((uint)((byte)(uVar33 >> 1) & 1) * auVar43._4_4_);
        fVar86 = (float)((uint)((byte)(uVar33 >> 2) & 1) * auVar43._8_4_);
        fVar87 = (float)((uint)((byte)(uVar33 >> 3) & 1) * auVar43._12_4_);
        auVar71._0_4_ = fVar84 * local_2568._0_4_;
        auVar71._4_4_ = fVar85 * local_2568._4_4_;
        auVar71._8_4_ = fVar86 * local_2568._8_4_;
        auVar71._12_4_ = fVar87 * local_2568._12_4_;
        local_2528 = vminps_avx512vl(auVar71,auVar40);
        auVar72._0_4_ = fVar84 * local_2558._0_4_;
        auVar72._4_4_ = fVar85 * local_2558._4_4_;
        auVar72._8_4_ = fVar86 * local_2558._8_4_;
        auVar72._12_4_ = fVar87 * local_2558._12_4_;
        local_2518 = vminps_avx512vl(auVar72,auVar40);
        auVar73._8_4_ = 0x7f800000;
        auVar73._0_8_ = 0x7f8000007f800000;
        auVar73._12_4_ = 0x7f800000;
        auVar43 = vblendmps_avx512vl(auVar73,local_2508);
        auVar58._0_4_ = (uint)(bVar29 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar29 & 1) * 0x7f800000;
        bVar38 = (bool)(bVar29 >> 1 & 1);
        auVar58._4_4_ = (uint)bVar38 * auVar43._4_4_ | (uint)!bVar38 * 0x7f800000;
        bVar38 = (bool)(bVar29 >> 2 & 1);
        auVar58._8_4_ = (uint)bVar38 * auVar43._8_4_ | (uint)!bVar38 * 0x7f800000;
        auVar58._12_4_ =
             (uint)(bVar29 >> 3) * auVar43._12_4_ | (uint)!(bool)(bVar29 >> 3) * 0x7f800000;
        auVar43 = vshufps_avx(auVar58,auVar58,0xb1);
        auVar43 = vminps_avx(auVar43,auVar58);
        auVar60 = vshufpd_avx(auVar43,auVar43,1);
        auVar43 = vminps_avx(auVar60,auVar43);
        uVar22 = vcmpps_avx512vl(auVar58,auVar43,0);
        bVar30 = (byte)uVar22 & bVar29;
        do {
          bVar23 = bVar29;
          if (bVar30 != 0) {
            bVar23 = bVar30;
          }
          uVar24 = 0;
          for (uVar32 = (uint)bVar23; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
            uVar24 = uVar24 + 1;
          }
          uVar32 = uVar24 & 0xff;
          h.geomID = *(uint *)((long)&local_2428 + (ulong)uVar32 * 4);
          pGVar10 = (local_2600->geometries).items[h.geomID].ptr;
          if ((pGVar10->mask & uVar27) == 0) {
            bVar29 = ~(byte)(1 << (uVar24 & 0x1f)) & bVar29;
          }
          else {
            pRVar11 = context->args;
            if (pRVar11->filter == (RTCFilterFunctionN)0x0) {
              args.context = context->user;
              if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar33 = (ulong)(uVar32 << 2);
                fVar84 = *(float *)(local_2528 + uVar33);
                fVar85 = *(float *)(local_2518 + uVar33);
                (ray->super_RayK<1>).tfar = *(float *)(local_2508 + uVar33);
                (ray->Ng).field_0.field_0.x = *(float *)(local_24f8 + uVar33);
                (ray->Ng).field_0.field_0.y = *(float *)(local_24e8 + uVar33);
                (ray->Ng).field_0.field_0.z = *(float *)((long)local_24d8 + uVar33);
                ray->u = fVar84;
                ray->v = fVar85;
                ray->primID = *(uint *)((long)&local_2578 + uVar33);
                ray->geomID = h.geomID;
                ray->instID[0] = (args.context)->instID[0];
                ray->instPrimID[0] = (args.context)->instPrimID[0];
                break;
              }
            }
            else {
              args.context = context->user;
            }
            uVar33 = (ulong)(uVar32 * 4);
            h.Ng.field_0.field_0.x = *(float *)(local_24f8 + uVar33);
            h.Ng.field_0.field_0.y = *(float *)(local_24e8 + uVar33);
            h.Ng.field_0.field_0.z = *(float *)((long)local_24d8 + uVar33);
            h.u = *(float *)(local_2528 + uVar33);
            h.v = *(float *)(local_2518 + uVar33);
            h.primID = *(uint *)((long)&local_2578 + uVar33);
            h.instID[0] = (args.context)->instID[0];
            h.instPrimID[0] = (args.context)->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_2508 + uVar33);
            local_2624 = -1;
            args.valid = &local_2624;
            args.geometryUserPtr = pGVar10->userPtr;
            args.ray = (RTCRayN *)ray;
            args.hit = (RTCHitN *)&h;
            args.N = 1;
            auVar43 = auVar75._0_16_;
            if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c5c742:
              if ((pRVar11->filter != (RTCFilterFunctionN)0x0) &&
                 (((pRVar11->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0))))
              {
                (*pRVar11->filter)(&args);
                auVar75 = ZEXT1664(auVar43);
                auVar100 = ZEXT3264(local_24c8);
                auVar99 = ZEXT3264(local_24a8);
                auVar98 = ZEXT3264(local_2488);
                auVar97 = ZEXT3264(local_2468);
                auVar96 = ZEXT3264(local_2448);
                auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar95 = ZEXT1664(auVar60);
                if (*args.valid == 0) goto LAB_01c5c837;
              }
              *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
              *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
              *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
              *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
              *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
              *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
              *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
              *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
              *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
            }
            else {
              (*pGVar10->intersectionFilterN)(&args);
              auVar75 = ZEXT1664(auVar43);
              auVar100 = ZEXT3264(local_24c8);
              auVar99 = ZEXT3264(local_24a8);
              auVar98 = ZEXT3264(local_2488);
              auVar97 = ZEXT3264(local_2468);
              auVar96 = ZEXT3264(local_2448);
              auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar95 = ZEXT1664(auVar60);
              if (*args.valid != 0) goto LAB_01c5c742;
LAB_01c5c837:
              auVar75 = ZEXT1664(auVar43);
              local_2598 = auVar83._0_4_;
              (ray->super_RayK<1>).tfar = local_2598;
            }
            auVar4._0_4_ = (ray->super_RayK<1>).tfar;
            auVar4._4_4_ = (ray->super_RayK<1>).mask;
            auVar4._8_4_ = (ray->super_RayK<1>).id;
            auVar4._12_4_ = (ray->super_RayK<1>).flags;
            auVar83 = ZEXT1664(auVar4);
            fVar84 = (ray->super_RayK<1>).tfar;
            auVar25._4_4_ = fVar84;
            auVar25._0_4_ = fVar84;
            auVar25._8_4_ = fVar84;
            auVar25._12_4_ = fVar84;
            uVar22 = vcmpps_avx512vl(auVar75._0_16_,auVar25,2);
            bVar29 = ~(byte)(1 << (uVar24 & 0x1f)) & bVar29 & (byte)uVar22;
            uVar27 = vextractps_avx(auVar4,1);
          }
          if (bVar29 == 0) break;
          auVar74._8_4_ = 0x7f800000;
          auVar74._0_8_ = 0x7f8000007f800000;
          auVar74._12_4_ = 0x7f800000;
          auVar43 = vblendmps_avx512vl(auVar74,auVar75._0_16_);
          auVar61._0_4_ =
               (uint)(bVar29 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar29 & 1) * 0x7f800000;
          bVar38 = (bool)(bVar29 >> 1 & 1);
          auVar61._4_4_ = (uint)bVar38 * auVar43._4_4_ | (uint)!bVar38 * 0x7f800000;
          bVar38 = (bool)(bVar29 >> 2 & 1);
          auVar61._8_4_ = (uint)bVar38 * auVar43._8_4_ | (uint)!bVar38 * 0x7f800000;
          auVar61._12_4_ =
               (uint)(bVar29 >> 3) * auVar43._12_4_ | (uint)!(bool)(bVar29 >> 3) * 0x7f800000;
          auVar43 = vshufps_avx(auVar61,auVar61,0xb1);
          auVar43 = vminps_avx(auVar43,auVar61);
          auVar60 = vshufpd_avx(auVar43,auVar43,1);
          auVar43 = vminps_avx(auVar60,auVar43);
          uVar22 = vcmpps_avx512vl(auVar61,auVar43,0);
          bVar30 = (byte)uVar22 & bVar29;
        } while( true );
      }
    }
    auVar83 = ZEXT3264(local_2398);
    auVar90 = ZEXT3264(local_23d8);
    auVar91 = ZEXT3264(local_23f8);
    auVar92 = ZEXT3264(local_2418);
    uVar33 = local_2618;
    fVar70 = local_23b8;
    fVar84 = fStack_23b4;
    fVar85 = fStack_23b0;
    fVar86 = fStack_23ac;
    fVar87 = fStack_23a8;
    fVar88 = fStack_23a4;
    fVar89 = fStack_23a0;
  }
  fVar2 = (ray->super_RayK<1>).tfar;
  auVar75 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412(fVar2
                                                  ,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))));
  auVar62 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar93 = ZEXT3264(auVar62);
  auVar62 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar94 = ZEXT3264(auVar62);
  goto LAB_01c5bc19;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }